

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

_Bool page_trylock_add(uc_struct_conflict15 *uc,page_collection *set,tb_page_addr_t addr)

{
  gpointer pvVar1;
  PageDesc *pd_00;
  page_entry *value;
  PageDesc *pd;
  page_entry *pe;
  tb_page_addr_t index;
  tb_page_addr_t addr_local;
  page_collection *set_local;
  uc_struct_conflict15 *uc_local;
  
  pe = (page_entry *)(addr >> 0xe);
  index = addr;
  addr_local = (tb_page_addr_t)set;
  set_local = (page_collection *)uc;
  pvVar1 = g_tree_lookup(set->tree,&pe);
  if ((pvVar1 == (gpointer)0x0) &&
     (pd_00 = page_find((uc_struct_conflict15 *)set_local,(tb_page_addr_t)pe),
     pd_00 != (PageDesc *)0x0)) {
    value = page_entry_new(pd_00,(tb_page_addr_t)pe);
    g_tree_insert(*(GTree **)addr_local,&value->index,value);
    if ((*(long *)(addr_local + 8) == 0) ||
       (*(ulong *)(*(long *)(addr_local + 8) + 8) < value->index)) {
      *(page_entry **)(addr_local + 8) = value;
    }
  }
  return false;
}

Assistant:

static bool page_trylock_add(struct uc_struct *uc, struct page_collection *set, tb_page_addr_t addr)
{
    tb_page_addr_t index = addr >> TARGET_PAGE_BITS;
    struct page_entry *pe;
    PageDesc *pd;

    pe = g_tree_lookup(set->tree, &index);
    if (pe) {
        return false;
    }

    pd = page_find(uc, index);
    if (pd == NULL) {
        return false;
    }

    pe = page_entry_new(pd, index);
    g_tree_insert(set->tree, &pe->index, pe);

    /*
     * If this is either (1) the first insertion or (2) a page whose index
     * is higher than any other so far, just lock the page and move on.
     */
    if (set->max == NULL || pe->index > set->max->index) {
        set->max = pe;
#if 0
        do_page_entry_lock(pe);
#endif
        return false;
    }
    /*
     * Try to acquire out-of-order lock; if busy, return busy so that we acquire
     * locks in order.
     */
#if 0
    return page_entry_trylock(pe);
#else
    return 0;
#endif
}